

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O3

ggml_tensor * __thiscall test_concat::build_graph(test_concat *this,ggml_context *ctx)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  ggml_tensor *pgVar4;
  char *pcVar5;
  array<long,_4UL> ne_b;
  array<long,_4UL> ne;
  undefined8 local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  local_68._0_4_ = (undefined4)(this->ne_a)._M_elems[0];
  local_68._4_4_ = *(undefined4 *)((long)(this->ne_a)._M_elems + 4);
  uStack_60 = (undefined4)(this->ne_a)._M_elems[1];
  uStack_5c = *(undefined4 *)((long)(this->ne_a)._M_elems + 0xc);
  local_58 = (undefined4)(this->ne_a)._M_elems[2];
  uStack_54 = *(undefined4 *)((long)(this->ne_a)._M_elems + 0x14);
  uStack_50 = (undefined4)(this->ne_a)._M_elems[3];
  uStack_4c = *(undefined4 *)((long)(this->ne_a)._M_elems + 0x1c);
  (&local_68)[this->dim] = this->ne_b_d;
  if ((this->v & 1) == 0) {
    uVar1 = ggml_new_tensor(ctx,this->type,4);
    test_case::add_sentinel(&this->super_test_case,ctx);
    pcVar5 = "a";
  }
  else {
    uStack_30 = (undefined4)(this->ne_a)._M_elems[3];
    uStack_2c = *(undefined4 *)((long)(this->ne_a)._M_elems + 0x1c);
    local_48 = (this->ne_a)._M_elems[0] << 1;
    uStack_40 = (this->ne_a)._M_elems[1] << 2;
    local_38 = (this->ne_a)._M_elems[2] * 3;
    lVar3 = ggml_new_tensor(ctx,this->type,4);
    test_case::add_sentinel(&this->super_test_case,ctx);
    ggml_set_name(lVar3,"a");
    uVar1 = ggml_view_4d(ctx,lVar3,(this->ne_a)._M_elems[0],(this->ne_a)._M_elems[1],
                         (this->ne_a)._M_elems[2],(this->ne_a)._M_elems[3],
                         *(undefined4 *)(lVar3 + 0x38),*(undefined4 *)(lVar3 + 0x40),
                         *(undefined8 *)(lVar3 + 0x48),0);
    pcVar5 = "view_of_a";
  }
  ggml_set_name(uVar1,pcVar5);
  if ((this->v & 2) == 0) {
    uVar2 = ggml_new_tensor(ctx,this->type,4,&local_68);
    test_case::add_sentinel(&this->super_test_case,ctx);
    pcVar5 = "b";
  }
  else {
    local_48 = CONCAT44(local_68._4_4_,(undefined4)local_68);
    uStack_40 = CONCAT44(uStack_5c,uStack_60);
    local_38 = CONCAT44(uStack_54,local_58);
    uStack_30 = uStack_50;
    uStack_2c = uStack_4c;
    local_48 = local_48 * 3;
    uStack_40 = uStack_40 << 1;
    local_38 = local_38 << 2;
    lVar3 = ggml_new_tensor(ctx,this->type,4);
    test_case::add_sentinel(&this->super_test_case,ctx);
    ggml_set_name(lVar3,"b");
    uVar2 = ggml_view_4d(ctx,lVar3,CONCAT44(local_68._4_4_,(undefined4)local_68),
                         CONCAT44(uStack_5c,uStack_60),CONCAT44(uStack_54,local_58),
                         CONCAT44(uStack_4c,uStack_50),*(undefined4 *)(lVar3 + 0x38),
                         *(undefined4 *)(lVar3 + 0x40),*(undefined8 *)(lVar3 + 0x48),0);
    pcVar5 = "view_of_b";
  }
  ggml_set_name(uVar2,pcVar5);
  pgVar4 = (ggml_tensor *)ggml_concat(ctx,uVar1,uVar2,this->dim);
  ggml_set_name(pgVar4,"out");
  return pgVar4;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        auto ne_b = ne_a;
        ne_b[dim] = ne_b_d;
        ggml_tensor * a;
        if (v & 1) {
            auto ne = ne_a; ne[0] *= 2; ne[1] *= 4; ne[2] *= 3;
            a = ggml_new_tensor(ctx, type, 4, ne.data());
            ggml_set_name(a, "a");

            a = ggml_view_4d(ctx, a, ne_a[0], ne_a[1], ne_a[2], ne_a[3], a->nb[1], a->nb[2], a->nb[3], 0);
            ggml_set_name(a, "view_of_a");
        } else {
            a = ggml_new_tensor(ctx, type, 4, ne_a.data());
            ggml_set_name(a, "a");
        }
        ggml_tensor * b;
        if (v & 2) {
            auto ne = ne_b; ne[0] *= 3; ne[1] *= 2; ne[2] *= 4;
            b = ggml_new_tensor(ctx, type, 4, ne.data());
            ggml_set_name(b, "b");

            b = ggml_view_4d(ctx, b, ne_b[0], ne_b[1], ne_b[2], ne_b[3], b->nb[1], b->nb[2], b->nb[3], 0);
            ggml_set_name(b, "view_of_b");
        } else {
            b = ggml_new_tensor(ctx, type, 4, ne_b.data());
            ggml_set_name(b, "b");
        }

        ggml_tensor * out = ggml_concat(ctx, a, b, dim);
        ggml_set_name(out, "out");

        return out;
    }